

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O0

ssize_t __thiscall
anon_unknown.dwarf_eb2ac::MMIFStream::read(MMIFStream *this,int __fd,void *__buf,size_t __nbytes)

{
  InputExc *this_00;
  undefined4 in_register_00000034;
  bool retVal;
  Int64 n2;
  bool local_21;
  size_t local_20;
  
  if ((this->_length <= this->_pos) && ((int)__buf != 0)) {
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(this_00,"Unexpected end of file.");
    __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  local_20 = (size_t)(int)__buf;
  local_21 = this->_length - this->_pos <= local_20;
  if (local_21) {
    local_20 = this->_length - this->_pos;
  }
  local_21 = !local_21;
  memcpy((void *)CONCAT44(in_register_00000034,__fd),this->_buffer + this->_pos,local_20);
  this->_pos = local_20 + this->_pos;
  return CONCAT71((int7)((ulong)this >> 8),local_21);
}

Assistant:

bool
MMIFStream::read (char c[/*n*/], int n)
{
    if (_pos >= _length && n != 0)
	throw IEX_NAMESPACE::InputExc ("Unexpected end of file.");
        
    Int64 n2 = n;
    bool retVal = true;

    if (_length - _pos <= n2)
    {
        n2 = _length - _pos;
        retVal = false;
    }

    memcpy (c, &(_buffer[_pos]), n2);
    _pos += n2;
    return retVal;
}